

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compat.c
# Opt level: O2

int picnic_timingsafe_bcmp(void *a,void *b,size_t len)

{
  uint uVar1;
  size_t sVar2;
  uchar *p2;
  uchar *p1;
  
  uVar1 = 0;
  for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = uVar1 | *(byte *)((long)b + sVar2) ^ *(byte *)((long)a + sVar2);
  }
  return uVar1;
}

Assistant:

int picnic_timingsafe_bcmp(const void* a, const void* b, size_t len) {
#if defined(HAVE_CONSTTIME_MEMEQUAL)
  return !consttime_memequal(a, b, len);
#else
  const unsigned char* p1 = a;
  const unsigned char* p2 = b;

  unsigned int res = 0;
  for (; len; --len, ++p1, ++p2) {
    res |= *p1 ^ *p2;
  }
  return res;
#endif
}